

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<float_const&,float_const&,float_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,pbrt::MajorantGrid_const*const&>
               (string *s,char *fmt,float *v,float *args,float *args_1,int *args_2,int *args_3,
               int *args_4,int *args_5,int *args_6,int *args_7,int *args_8,int *args_9,int *args_10,
               MajorantGrid **args_11)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  char *in_RCX;
  string *in_RDX;
  int *unaff_RBP;
  string *in_RDI;
  float *in_R8;
  float *in_R9;
  int *unaff_R15;
  int *unaff_retaddr;
  int *in_stack_00000008;
  int *in_stack_00000010;
  int *in_stack_00000018;
  int *in_stack_00000020;
  MajorantGrid **in_stack_00000028;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  char *in_stack_fffffffffffffd08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd10;
  string *in_stack_fffffffffffffd30;
  char **in_stack_fffffffffffffd38;
  char **in_stack_fffffffffffffd40;
  char *in_stack_fffffffffffffd48;
  string local_2a8 [32];
  string local_288 [32];
  undefined8 local_268;
  string local_260 [24];
  char *in_stack_fffffffffffffdb8;
  stringstream local_240 [4];
  int in_stack_fffffffffffffdc4;
  char *in_stack_fffffffffffffdc8;
  undefined1 local_230 [4];
  LogLevel in_stack_fffffffffffffdd4;
  float in_stack_fffffffffffffe0c;
  string local_b8 [53];
  byte local_83;
  byte local_82;
  byte local_81;
  string local_80 [16];
  int *in_stack_ffffffffffffff90;
  int *in_stack_ffffffffffffff98;
  
  copyToFormatString(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  lVar2 = std::__cxx11::string::find((char)local_80,0x2a);
  local_81 = lVar2 != -1;
  lVar2 = std::__cxx11::string::find((char)local_80,0x73);
  local_82 = lVar2 != -1;
  lVar2 = std::__cxx11::string::find((char)local_80,100);
  local_83 = lVar2 != -1;
  if ((local_81 & 1) != 0) {
    LogFatal(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4,
             in_stack_fffffffffffffdb8);
  }
  bVar1 = std::operator==(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  if ((bVar1) ||
     (bVar1 = std::operator==(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08), bVar1)) {
    FloatToString_abi_cxx11_(in_stack_fffffffffffffe0c);
    std::__cxx11::string::operator+=(in_RDI,local_b8);
    std::__cxx11::string::~string(local_b8);
  }
  else {
    if ((local_83 & 1) != 0) {
      LogFatal(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4,
               in_stack_fffffffffffffdb8);
    }
    if ((local_82 & 1) == 0) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        LogFatal(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4,
                 in_stack_fffffffffffffdb8);
      }
      std::__cxx11::string::c_str();
      formatOne<float_const&>(in_stack_fffffffffffffd48,(float *)in_stack_fffffffffffffd40);
      std::__cxx11::string::operator+=(in_RDI,local_2a8);
      std::__cxx11::string::~string(local_2a8);
    }
    else {
      std::__cxx11::stringstream::stringstream(local_240);
      std::ostream::operator<<(local_230,*(float *)in_RDX);
      std::__cxx11::string::c_str();
      std::__cxx11::stringstream::str();
      local_268 = std::__cxx11::string::c_str();
      formatOne<char_const*>(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
      std::__cxx11::string::operator+=(in_RDI,local_260);
      std::__cxx11::string::~string(local_260);
      std::__cxx11::string::~string(local_288);
      std::__cxx11::stringstream::~stringstream(local_240);
    }
  }
  stringPrintfRecursive<float_const&,float_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,pbrt::MajorantGrid_const*const&>
            (in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,unaff_R15
             ,unaff_RBP,unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018,
             in_stack_00000020,in_stack_00000028);
  std::__cxx11::string::~string(local_80);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&...args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same_v<std::decay_t<T>, float>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, double>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, bool>)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}